

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O2

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  int iVar1;
  APlayerPawn *this_00;
  bool bVar2;
  bool bVar3;
  AActor *pAVar4;
  PClassActor *pPVar5;
  AInventory *pAVar6;
  AWeapon *pAVar7;
  AAmmo *pAVar8;
  PClass *pPVar9;
  AAmmo *ammo;
  TObjPtr<AAmmo> *pTVar10;
  
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->prev);
  if (pAVar4 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = ((byte)dmflags.Value & 4) == 0;
  }
  bVar2 = DObject::IsKindOf((DObject *)item,AWeapon::RegistrationInfo.MyClass);
  if (bVar2) {
    this_00 = this->player->mo;
    pPVar5 = (PClassActor *)DObject::GetClass((DObject *)item);
    pAVar6 = AActor::FindInventory(&this_00->super_AActor,pPVar5,false);
    pAVar7 = dyn_cast<AWeapon>((DObject *)pAVar6);
    if (pAVar7 != (AWeapon *)0x0) {
      if (!bVar3) {
        return;
      }
      pTVar10 = &pAVar7->Ammo1;
      pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
      if (pAVar8 != (AAmmo *)0x0) {
        pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
        iVar1 = (pAVar8->super_AInventory).Amount;
        pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
        if (iVar1 < (pAVar8->super_AInventory).MaxAmount) goto LAB_00421768;
      }
      pTVar10 = &pAVar7->Ammo2;
      pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
      if (pAVar8 == (AAmmo *)0x0) {
        return;
      }
      pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
      iVar1 = (pAVar8->super_AInventory).Amount;
      pAVar8 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar10);
      if ((pAVar8->super_AInventory).MaxAmount <= iVar1) {
        return;
      }
    }
    goto LAB_00421768;
  }
  bVar3 = DObject::IsKindOf((DObject *)item,AAmmo::RegistrationInfo.MyClass);
  if (bVar3) {
    pPVar5 = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar6 = AActor::FindInventory(&this->player->mo->super_AActor,pPVar5,false);
    if ((pAVar6 != (AInventory *)0x0) && (pAVar6->MaxAmount <= pAVar6->Amount)) {
      return;
    }
    goto LAB_00421768;
  }
  pPVar9 = PClass::FindClass("Megasphere");
  bVar3 = DObject::IsKindOf((DObject *)item,pPVar9);
  if (bVar3) {
LAB_00421720:
    if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
      return;
    }
  }
  else {
    pPVar9 = PClass::FindClass("Soulsphere");
    bVar3 = DObject::IsKindOf((DObject *)item,pPVar9);
    if (bVar3) goto LAB_00421720;
    pPVar9 = PClass::FindClass("HealthBonus");
    bVar3 = DObject::IsKindOf((DObject *)item,pPVar9);
    if (bVar3) goto LAB_00421720;
  }
  bVar3 = DObject::IsKindOf((DObject *)item,AHealth::RegistrationInfo.MyClass);
  if ((bVar3) && (deh.MaxHealth <= (this->player->mo->super_AActor).health)) {
    return;
  }
LAB_00421768:
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->dest);
  if ((pAVar4 == (AActor *)0x0) ||
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->dest), ((pAVar4->flags).Value & 1) == 0)) {
    (this->prev).field_0 = (this->dest).field_0;
    (this->dest).field_0.p = item;
    this->t_roam = 0x8c;
  }
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= deh.MaxHealth /*MAXHEALTH*/)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}